

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

uint * Cec_ManComputeInitState(Gia_Man_t *pAig,int nFrames)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  uint *p;
  bool bVar7;
  int local_40;
  int local_3c;
  int f;
  int i;
  uint *pInitState;
  Gia_Obj_t *pObjRi;
  Gia_Obj_t *pObjRo;
  Gia_Obj_t *pObj;
  int nFrames_local;
  Gia_Man_t *pAig_local;
  
  Gia_ManRandom(1);
  local_3c = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(pAig);
    bVar7 = false;
    if (local_3c < iVar3) {
      iVar3 = Gia_ManPiNum(pAig);
      pObjRo = Gia_ManCi(pAig,iVar3 + local_3c);
      bVar7 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff;
    local_3c = local_3c + 1;
  }
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    pGVar6 = Gia_ManConst0(pAig);
    *(ulong *)pGVar6 = *(ulong *)pGVar6 & 0xbfffffffffffffff;
    local_3c = 0;
    while( true ) {
      iVar3 = Gia_ManPiNum(pAig);
      bVar7 = false;
      if (local_3c < iVar3) {
        pObjRo = Gia_ManCi(pAig,local_3c);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      uVar5 = Gia_ManRandom(0);
      *(ulong *)pObjRo = *(ulong *)pObjRo & 0xbfffffffffffffff | (ulong)(uVar5 & 1) << 0x3e;
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      bVar7 = false;
      if (local_3c < pAig->nObjs) {
        pObjRo = Gia_ManObj(pAig,local_3c);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjIsAnd(pObjRo);
      if (iVar3 != 0) {
        pGVar6 = Gia_ObjFanin0(pObjRo);
        uVar2 = *(undefined8 *)pGVar6;
        uVar5 = Gia_ObjFaninC0(pObjRo);
        pGVar6 = Gia_ObjFanin1(pObjRo);
        uVar1 = *(undefined8 *)pGVar6;
        uVar4 = Gia_ObjFaninC1(pObjRo);
        *(ulong *)pObjRo =
             *(ulong *)pObjRo & 0xbfffffffffffffff |
             ((ulong)(((uint)((ulong)uVar2 >> 0x3e) & 1 ^ uVar5) &
                     ((uint)((ulong)uVar1 >> 0x3e) & 1 ^ uVar4)) & 1) << 0x3e;
      }
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(pAig);
      bVar7 = false;
      if (local_3c < iVar3) {
        iVar3 = Gia_ManPoNum(pAig);
        pObjRo = Gia_ManCo(pAig,iVar3 + local_3c);
        bVar7 = pObjRo != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0(pObjRo);
      uVar2 = *(undefined8 *)pGVar6;
      uVar5 = Gia_ObjFaninC0(pObjRo);
      *(ulong *)pObjRo =
           *(ulong *)pObjRo & 0xbfffffffffffffff |
           ((ulong)((uint)((ulong)uVar2 >> 0x3e) & 1 ^ uVar5) & 1) << 0x3e;
      local_3c = local_3c + 1;
    }
    local_3c = 0;
    while( true ) {
      iVar3 = Gia_ManRegNum(pAig);
      bVar7 = false;
      if (local_3c < iVar3) {
        iVar3 = Gia_ManPoNum(pAig);
        pInitState = (uint *)Gia_ManCo(pAig,iVar3 + local_3c);
        bVar7 = false;
        if ((Gia_Obj_t *)pInitState != (Gia_Obj_t *)0x0) {
          iVar3 = Gia_ManPiNum(pAig);
          pObjRi = Gia_ManCi(pAig,iVar3 + local_3c);
          bVar7 = pObjRi != (Gia_Obj_t *)0x0;
        }
      }
      if (!bVar7) break;
      *(ulong *)pObjRi =
           *(ulong *)pObjRi & 0xbfffffffffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)pInitState >> 0x3e) & 1) << 0x3e;
      local_3c = local_3c + 1;
    }
  }
  iVar3 = Gia_ManRegNum(pAig);
  iVar3 = Abc_BitWordNum(iVar3);
  p = (uint *)calloc((long)iVar3,4);
  local_3c = 0;
  while( true ) {
    iVar3 = Gia_ManRegNum(pAig);
    bVar7 = false;
    if (local_3c < iVar3) {
      iVar3 = Gia_ManPiNum(pAig);
      pObjRo = Gia_ManCi(pAig,iVar3 + local_3c);
      bVar7 = pObjRo != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    if ((*(ulong *)pObjRo >> 0x3e & 1) != 0) {
      Abc_InfoSetBit(p,local_3c);
    }
    local_3c = local_3c + 1;
  }
  Gia_ManCleanMark1(pAig);
  return p;
}

Assistant:

unsigned * Cec_ManComputeInitState( Gia_Man_t * pAig, int nFrames )
{  
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    unsigned * pInitState;
    int i, f; 
    Gia_ManRandom( 1 );
//    Abc_Print( 1, "Simulating %d timeframes.\n", nFrames );
    Gia_ManForEachRo( pAig, pObj, i )
        pObj->fMark1 = 0;
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ManConst0(pAig)->fMark1 = 0;
        Gia_ManForEachPi( pAig, pObj, i )
            pObj->fMark1 = Gia_ManRandom(0) & 1;
        Gia_ManForEachAnd( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj)) & 
                (Gia_ObjFanin1(pObj)->fMark1 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachRi( pAig, pObj, i )
            pObj->fMark1 = (Gia_ObjFanin0(pObj)->fMark1 ^ Gia_ObjFaninC0(pObj));
        Gia_ManForEachRiRo( pAig, pObjRi, pObjRo, i )
            pObjRo->fMark1 = pObjRi->fMark1;
    }
    pInitState = ABC_CALLOC( unsigned, Abc_BitWordNum(Gia_ManRegNum(pAig)) );
    Gia_ManForEachRo( pAig, pObj, i )
    {
        if ( pObj->fMark1 )
            Abc_InfoSetBit( pInitState, i );
//        Abc_Print( 1, "%d", pObj->fMark1 );
    }
//    Abc_Print( 1, "\n" );
    Gia_ManCleanMark1( pAig );
    return pInitState;
}